

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::TraverseSchema::checkFixedFacet
          (TraverseSchema *this,DOMElement *elem,XMLCh *facetName,DatatypeValidator *baseDV,
          uint *flags)

{
  bool bVar1;
  ValidatorType VVar2;
  XMLCh *str1;
  XMLCh *fixedFacet;
  uint *flags_local;
  DatatypeValidator *baseDV_local;
  XMLCh *facetName_local;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  
  str1 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_FIXED,UnKnown);
  if (((str1 != (XMLCh *)0x0) && (*str1 != L'\0')) &&
     ((bVar1 = XMLString::equals(str1,(XMLCh *)SchemaSymbols::fgATTVAL_TRUE), bVar1 ||
      (bVar1 = XMLString::equals(str1,L"1"), bVar1)))) {
    bVar1 = XMLString::equals((XMLCh *)SchemaSymbols::fgELT_LENGTH,facetName);
    if (bVar1) {
      *flags = *flags | 1;
    }
    bVar1 = XMLString::equals((XMLCh *)SchemaSymbols::fgELT_MINLENGTH,facetName);
    if (bVar1) {
      *flags = *flags | 2;
    }
    else {
      bVar1 = XMLString::equals((XMLCh *)SchemaSymbols::fgELT_MAXLENGTH,facetName);
      if (bVar1) {
        *flags = *flags | 4;
      }
      else {
        bVar1 = XMLString::equals((XMLCh *)SchemaSymbols::fgELT_MAXEXCLUSIVE,facetName);
        if (bVar1) {
          *flags = *flags | 0x40;
        }
        else {
          bVar1 = XMLString::equals((XMLCh *)SchemaSymbols::fgELT_MAXINCLUSIVE,facetName);
          if (bVar1) {
            *flags = *flags | 0x20;
          }
          else {
            bVar1 = XMLString::equals((XMLCh *)SchemaSymbols::fgELT_MINEXCLUSIVE,facetName);
            if (bVar1) {
              *flags = *flags | 0x100;
            }
            else {
              bVar1 = XMLString::equals((XMLCh *)SchemaSymbols::fgELT_MININCLUSIVE,facetName);
              if (bVar1) {
                *flags = *flags | 0x80;
              }
              else {
                bVar1 = XMLString::equals((XMLCh *)SchemaSymbols::fgELT_TOTALDIGITS,facetName);
                if (bVar1) {
                  *flags = *flags | 0x200;
                }
                else {
                  bVar1 = XMLString::equals((XMLCh *)SchemaSymbols::fgELT_FRACTIONDIGITS,facetName);
                  if (bVar1) {
                    *flags = *flags | 0x400;
                  }
                  else {
                    bVar1 = XMLString::equals((XMLCh *)SchemaSymbols::fgELT_WHITESPACE,facetName);
                    if ((bVar1) && (VVar2 = DatatypeValidator::getType(baseDV), VVar2 == String)) {
                      *flags = *flags | 0x4000;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void TraverseSchema::checkFixedFacet(const DOMElement* const elem,
                                     const XMLCh* const facetName,
                                     const DatatypeValidator* const baseDV,
                                     unsigned int& flags)
{
    const XMLCh* fixedFacet = getElementAttValue(elem, SchemaSymbols::fgATT_FIXED);

    if ((fixedFacet && *fixedFacet) &&
        (XMLString::equals(fixedFacet, SchemaSymbols::fgATTVAL_TRUE)
         || XMLString::equals(fixedFacet, fgValueOne))) {

        if (XMLString::equals(SchemaSymbols::fgELT_LENGTH, facetName)) {
            flags |= DatatypeValidator::FACET_LENGTH;
        }
        if (XMLString::equals(SchemaSymbols::fgELT_MINLENGTH, facetName)) {
            flags |= DatatypeValidator::FACET_MINLENGTH;
        }
        else if (XMLString::equals(SchemaSymbols::fgELT_MAXLENGTH, facetName)) {
            flags |= DatatypeValidator::FACET_MAXLENGTH;
        }
        else if (XMLString::equals(SchemaSymbols::fgELT_MAXEXCLUSIVE, facetName)) {
            flags |= DatatypeValidator::FACET_MAXEXCLUSIVE;
        }
        else if (XMLString::equals(SchemaSymbols::fgELT_MAXINCLUSIVE, facetName)) {
            flags |= DatatypeValidator::FACET_MAXINCLUSIVE;
        }
        else if (XMLString::equals(SchemaSymbols::fgELT_MINEXCLUSIVE, facetName)) {
            flags |= DatatypeValidator::FACET_MINEXCLUSIVE;
        }
        else if (XMLString::equals(SchemaSymbols::fgELT_MININCLUSIVE, facetName)) {
            flags |= DatatypeValidator::FACET_MININCLUSIVE;
        }
        else if (XMLString::equals(SchemaSymbols::fgELT_TOTALDIGITS, facetName)) {
            flags |= DatatypeValidator::FACET_TOTALDIGITS;
        }
        else if (XMLString::equals(SchemaSymbols::fgELT_FRACTIONDIGITS, facetName)) {
            flags |= DatatypeValidator::FACET_FRACTIONDIGITS;
        }
        else if ((XMLString::equals(SchemaSymbols::fgELT_WHITESPACE, facetName)) &&
                 baseDV->getType() == DatatypeValidator::String) {
            flags |= DatatypeValidator::FACET_WHITESPACE;
        }
    }
}